

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer_allocator.cpp
# Opt level: O3

torrent_peer * __thiscall
libtorrent::torrent_peer_allocator::allocate_peer_entry(torrent_peer_allocator *this,int type)

{
  undefined4 uVar1;
  undefined4 uVar2;
  torrent_peer *ptVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  pool<boost::default_user_allocator_new_delete> *this_00;
  long lVar7;
  
  if (type == 2) {
    this_00 = &this->m_i2p_peer_pool;
    ptVar3 = (torrent_peer *)
             (this->m_i2p_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
    if (ptVar3 == (torrent_peer *)0x0) {
      ptVar3 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc_need_resize(this_00);
      if (ptVar3 == (torrent_peer *)0x0) goto LAB_00300602;
      iVar4 = 0x28;
      uVar5 = 0x28;
      lVar6 = 0x98;
      lVar7 = 0xa0;
    }
    else {
      iVar4 = 0x28;
      uVar5 = 0x28;
      lVar6 = 0x98;
      lVar7 = 0xa0;
LAB_00300540:
      (this_00->super_simple_segregated_storage<unsigned_long>).first = *(void **)ptVar3;
    }
LAB_00300546:
    *(undefined8 *)
     ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface +
     lVar7) = 500;
    *(undefined8 *)
     ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface +
     lVar6) = 500;
    uVar1 = this->m_live_bytes;
    uVar2 = this->m_live_allocations;
    this->m_live_bytes = iVar4 + uVar1;
    this->m_live_allocations = uVar2 + 1;
    this->m_total_bytes = (ulong)uVar5 + this->m_total_bytes;
    this->m_total_allocations = this->m_total_allocations + 1;
  }
  else {
    if (type == 1) {
      this_00 = &this->m_ipv6_peer_pool;
      ptVar3 = (torrent_peer *)
               (this->m_ipv6_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
      if (ptVar3 != (torrent_peer *)0x0) {
        iVar4 = 0x30;
        uVar5 = 0x30;
        lVar6 = 0x60;
        lVar7 = 0x68;
        goto LAB_00300540;
      }
      ptVar3 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc_need_resize(this_00);
      if (ptVar3 != (torrent_peer *)0x0) {
        iVar4 = 0x30;
        uVar5 = 0x30;
        lVar6 = 0x60;
        lVar7 = 0x68;
        goto LAB_00300546;
      }
    }
    else if (type == 0) {
      this_00 = &this->m_ipv4_peer_pool;
      ptVar3 = (torrent_peer *)
               (this->m_ipv4_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
      if (ptVar3 != (torrent_peer *)0x0) {
        iVar4 = 0x28;
        lVar6 = 0x28;
        lVar7 = 0x30;
        uVar5 = 0x28;
        goto LAB_00300540;
      }
      ptVar3 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc_need_resize(this_00);
      if (ptVar3 != (torrent_peer *)0x0) {
        iVar4 = 0x28;
        lVar6 = 0x28;
        lVar7 = 0x30;
        uVar5 = 0x28;
        goto LAB_00300546;
      }
    }
LAB_00300602:
    ptVar3 = (torrent_peer *)0x0;
  }
  return ptVar3;
}

Assistant:

torrent_peer* torrent_peer_allocator::allocate_peer_entry(int type)
	{
		TORRENT_ASSERT(m_in_use);
		torrent_peer* p = nullptr;
		switch(type)
		{
			case torrent_peer_allocator_interface::ipv4_peer_type:
				p = static_cast<torrent_peer*>(m_ipv4_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv4_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::ipv4_peer);
				m_live_bytes += sizeof(libtorrent::ipv4_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
			case torrent_peer_allocator_interface::ipv6_peer_type:
				p = static_cast<torrent_peer*>(m_ipv6_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv6_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::ipv6_peer);
				m_live_bytes += sizeof(libtorrent::ipv6_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#if TORRENT_USE_I2P
			case torrent_peer_allocator_interface::i2p_peer_type:
				p = static_cast<torrent_peer*>(m_i2p_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_i2p_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::i2p_peer);
				m_live_bytes += sizeof(libtorrent::i2p_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#endif
		}
		return p;
	}